

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1_pack1to4_int8.h
# Opt level: O1

void ncnn::conv1x1s2_sgemm_pack1to4_int8_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Option *opt)

{
  int iVar1;
  uint _c;
  uint _w;
  int _h;
  int *piVar2;
  ulong uVar3;
  undefined1 *puVar4;
  undefined1 *puVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  Mat local_88;
  Mat *local_40;
  Option *local_38;
  
  iVar1 = bottom_blob->w;
  _c = bottom_blob->c;
  _w = top_blob->w;
  _h = top_blob->h;
  local_88.cstep = 0;
  local_88.data = (void *)0x0;
  local_88.refcount._0_4_ = 0;
  local_88.refcount._4_4_ = 0;
  local_88.elemsize._0_4_ = 0;
  local_88.elemsize._4_4_ = 0;
  local_88.elempack = 0;
  local_88.allocator = (Allocator *)0x0;
  local_88.dims = 0;
  local_88.w = 0;
  local_88.h = 0;
  local_88.d = 0;
  local_88.c = 0;
  local_40 = kernel;
  local_38 = opt;
  Mat::create(&local_88,_w,_h,_c,bottom_blob->elemsize,bottom_blob->elempack,
              opt->workspace_allocator);
  if (0 < (int)_c) {
    uVar3 = 0;
    do {
      if (0 < _h) {
        puVar4 = (undefined1 *)
                 (local_88.cstep * uVar3 *
                  CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize) +
                 (long)local_88.data);
        puVar5 = (undefined1 *)
                 (bottom_blob->cstep * uVar3 * bottom_blob->elemsize + (long)bottom_blob->data);
        iVar6 = 0;
        do {
          if ((int)_w < 4) {
            uVar8 = 0;
          }
          else {
            iVar7 = 3;
            do {
              *puVar4 = *puVar5;
              puVar4[1] = puVar5[2];
              puVar4[2] = puVar5[4];
              puVar4[3] = puVar5[6];
              puVar5 = puVar5 + 8;
              puVar4 = puVar4 + 4;
              iVar7 = iVar7 + 4;
              uVar8 = _w & 0xfffffffc;
            } while (iVar7 < (int)_w);
          }
          uVar9 = uVar8 | 1;
          while ((int)uVar9 < (int)_w) {
            *puVar4 = *puVar5;
            puVar4[1] = puVar5[2];
            puVar5 = puVar5 + 4;
            puVar4 = puVar4 + 2;
            uVar9 = uVar8 + 3;
            uVar8 = uVar8 + 2;
          }
          iVar7 = _w - uVar8;
          if (iVar7 != 0 && (int)uVar8 <= (int)_w) {
            do {
              *puVar4 = *puVar5;
              puVar5 = puVar5 + 2;
              puVar4 = puVar4 + 1;
              iVar7 = iVar7 + -1;
            } while (iVar7 != 0);
          }
          puVar5 = puVar5 + (int)((iVar1 - _w) * 2);
          iVar6 = iVar6 + 1;
        } while (iVar6 != _h);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != _c);
  }
  conv1x1s1_sgemm_pack1to4_int8_sse(&local_88,top_blob,local_40,local_38);
  piVar2 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_88.allocator == (Allocator *)0x0) {
        if (local_88.data != (void *)0x0) {
          free(local_88.data);
        }
      }
      else {
        (*(local_88.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv1x1s2_sgemm_pack1to4_int8_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    int w = bottom_blob.w;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int tailstep = w - 2 * outw + w;

    Mat bottom_blob_shrinked;
    bottom_blob_shrinked.create(outw, outh, channels, elemsize, elempack, opt.workspace_allocator);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < channels; p++)
    {
        const signed char* r0 = bottom_blob.channel(p);
        signed char* outptr = bottom_blob_shrinked.channel(p);

        for (int i = 0; i < outh; i++)
        {
            int j = 0;
            for (; j + 3 < outw; j += 4)
            {
                outptr[0] = r0[0];
                outptr[1] = r0[2];
                outptr[2] = r0[4];
                outptr[3] = r0[6];

                r0 += 8;
                outptr += 4;
            }
            for (; j + 1 < outw; j += 2)
            {
                outptr[0] = r0[0];
                outptr[1] = r0[2];

                r0 += 4;
                outptr += 2;
            }
            for (; j < outw; j++)
            {
                outptr[0] = r0[0];

                r0 += 2;
                outptr += 1;
            }

            r0 += tailstep;
        }
    }

    conv1x1s1_sgemm_pack1to4_int8_sse(bottom_blob_shrinked, top_blob, kernel, opt);
}